

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

Result_conflict __thiscall
testing::internal::FunctionMocker<unsigned_long_()>::PerformDefaultAction
          (FunctionMocker<unsigned_long_()> *this,ArgumentTuple *args,string *call_description)

{
  OnCallSpec<unsigned_long_()> *this_00;
  Action<unsigned_long_()> *pAVar1;
  Result RVar2;
  unsigned_long uVar3;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_28;
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 != (OnCallSpec<unsigned_long_()> *)0x0) {
    pAVar1 = OnCallSpec<unsigned_long_()>::GetAction(this_00);
    RVar2 = Action<unsigned_long_()>::Perform(pAVar1);
    return RVar2;
  }
  std::operator+(&bStack_28,call_description,
                 "\n    The mock function has no default action set, and its return type has no default value set."
                );
  uVar3 = DefaultValue<unsigned_long>::Get();
  std::__cxx11::string::~string((string *)&bStack_28);
  return uVar3;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }